

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cpu.cpp
# Opt level: O2

Value __thiscall xmrig::Cpu::toJSON(Cpu *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  int iVar1;
  ICpuInfo *pIVar2;
  undefined4 extraout_var;
  size_t sVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined8 extraout_RDX;
  Value VVar4;
  StringRefType local_120;
  StringRefType local_110;
  StringRefType local_100;
  StringRefType local_f0;
  StringRefType local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  allocator = doc->allocator_;
  pIVar2 = info();
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined2 *)(this + 0xe) = 3;
  (*pIVar2->_vptr_ICpuInfo[2])(pIVar2);
  local_40.s = "brand";
  local_40.length = 5;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[6])(pIVar2);
  local_50.s = (Ch *)CONCAT44(extraout_var,iVar1);
  sVar3 = strlen(local_50.s);
  local_50.length = (SizeType)sVar3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,&local_40,&local_50,allocator);
  local_60.s = "aes";
  local_60.length = 3;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[3])(pIVar2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)this,&local_60,SUB41(iVar1,0),allocator);
  local_70.s = "avx2";
  local_70.length = 4;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[4])(pIVar2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)this,&local_70,SUB41(iVar1,0),allocator);
  local_80.s = "x64";
  local_80.length = 3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)this,&local_80,true,allocator);
  local_90.s = "l2";
  local_90.length = 2;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[9])(pIVar2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,&local_90,CONCAT44(extraout_var_00,iVar1),allocator);
  local_a0.s = "l3";
  local_a0.length = 2;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[10])(pIVar2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,&local_a0,CONCAT44(extraout_var_01,iVar1),allocator);
  local_b0.s = "cores";
  local_b0.length = 5;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[8])(pIVar2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,&local_b0,CONCAT44(extraout_var_02,iVar1),allocator);
  local_c0.s = "threads";
  local_c0.length = 7;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[0xd])(pIVar2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,&local_c0,CONCAT44(extraout_var_03,iVar1),allocator);
  local_d0.s = "packages";
  local_d0.length = 8;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[0xc])(pIVar2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,&local_d0,CONCAT44(extraout_var_04,iVar1),allocator);
  local_e0.s = "nodes";
  local_e0.length = 5;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[0xb])(pIVar2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,&local_e0,CONCAT44(extraout_var_05,iVar1),allocator);
  local_f0.s = "backend";
  local_f0.length = 7;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[5])(pIVar2);
  local_100.s = (Ch *)CONCAT44(extraout_var_06,iVar1);
  sVar3 = strlen(local_100.s);
  local_100.length = (SizeType)sVar3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,&local_f0,&local_100,allocator);
  local_110.s = "assembly";
  local_110.length = 8;
  local_120.s = "none";
  local_120.length = 4;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,&local_110,&local_120,allocator);
  VVar4.data_.s.str = (Ch *)extraout_RDX;
  VVar4.data_.n = (Number)this;
  return (Value)VVar4.data_;
}

Assistant:

rapidjson::Value xmrig::Cpu::toJSON(rapidjson::Document &doc)
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    ICpuInfo *i = info();
    Value cpu(kObjectType);
    Assembly assembly(i->assembly());

    cpu.AddMember("brand",      StringRef(i->brand()), allocator);
    cpu.AddMember("aes",        i->hasAES(), allocator);
    cpu.AddMember("avx2",       i->hasAVX2(), allocator);
    cpu.AddMember("x64",        ICpuInfo::isX64(), allocator);
    cpu.AddMember("l2",         static_cast<uint64_t>(i->L2()), allocator);
    cpu.AddMember("l3",         static_cast<uint64_t>(i->L3()), allocator);
    cpu.AddMember("cores",      static_cast<uint64_t>(i->cores()), allocator);
    cpu.AddMember("threads",    static_cast<uint64_t>(i->threads()), allocator);
    cpu.AddMember("packages",   static_cast<uint64_t>(i->packages()), allocator);
    cpu.AddMember("nodes",      static_cast<uint64_t>(i->nodes()), allocator);
    cpu.AddMember("backend",    StringRef(i->backend()), allocator);

    cpu.AddMember("assembly", "none", allocator);

    return cpu;
}